

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>
::
push_and_compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>
           *this,bit_array *x,
          reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *last,longdouble kappa,longdouble delta,longdouble theta,longdouble obj_amp)

{
  rc_data *prVar1;
  solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>
  *reduced_cost;
  int k;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *plVar2;
  bool bVar3;
  uint r_size;
  int selected;
  int *piVar4;
  int iVar5;
  row_iterator prVar6;
  long lVar7;
  __uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
  _Var8;
  rc_data *prVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  bool bVar16;
  rc_data *prVar17;
  string_view fmt;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  undefined1 local_90 [16];
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_80;
  longdouble local_74;
  longdouble local_68;
  longdouble local_58;
  longdouble local_48;
  
  local_74 = obj_amp;
  local_48 = kappa;
  local_58 = delta;
  local_68 = theta;
  fmt._M_str = "push-update-row {} {} {}\n";
  fmt._M_len = 0x19;
  debug_logger<true>::log<long_double,long_double,long_double>
            ((debug_logger<true> *)this,fmt,&local_48,&local_58,&local_68);
  piVar4 = (first->current)._M_current;
  if (piVar4 == (last->current)._M_current) {
    bVar16 = false;
  }
  else {
    reduced_cost = this + 0x60;
    local_80._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
    super__Head_base<0UL,_int_*,_false>._M_head_impl =
         (tuple<int_*,_std::default_delete<int[]>_>)((long)this + 0x10);
    bVar16 = false;
    do {
      k = piVar4[-1];
      sparse_matrix<int>::row
                ((sparse_matrix<int> *)local_90,
                 (int)local_80._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                      super__Head_base<0UL,_int_*,_false>._M_head_impl);
      if (local_90._8_8_ != local_90._0_8_) {
        lVar7 = *(long *)(this + 0x50);
        prVar6 = (row_iterator)local_90._8_8_;
        do {
          piVar4 = &prVar6->value;
          prVar6 = prVar6 + 1;
          lVar11 = (long)*piVar4 * 0x10;
          *(longdouble *)(lVar7 + lVar11) = *(longdouble *)(lVar7 + lVar11) * local_68;
        } while (prVar6 != (row_iterator)local_90._0_8_);
      }
      r_size = solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
               ::compute_reduced_costs<baryonyx::bit_array>
                         ((solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
                           *)this,(row_iterator)local_90._8_8_,(row_iterator)local_90._0_8_,x);
      if (r_size != 0) {
        lVar7 = *(long *)(this + 0x60);
        lVar12 = 0;
        lVar11 = *(long *)(*(long *)(this + 0x178) + 8);
        do {
          *(longdouble *)(lVar7 + lVar12) =
               *(longdouble *)(lVar7 + lVar12) +
               *(longdouble *)
                (lVar11 + (long)((row_iterator)
                                (local_90._8_8_ + (long)*(int *)(lVar7 + 0x10 + lVar12) * 8))->
                                column * 0x10) * local_74;
          lVar12 = lVar12 + 0x20;
        } while ((ulong)r_size << 5 != lVar12);
      }
      lVar7 = (long)k;
      switch(*(undefined1 *)(*(long *)(this + 0x68) + lVar7)) {
      case 0:
        if (1 < (int)r_size) {
          prVar9 = *(rc_data **)(this + 0x60);
          lVar11 = (long)(int)r_size;
          plVar2 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar1 = prVar9 + lVar11;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar9,prVar1,(int)LZCOUNT(lVar11) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar9,prVar1);
          lVar11 = lVar11 * 0x20 + -0x20;
          prVar17 = prVar9;
          do {
            prVar17 = prVar17 + 1;
            if ((prVar9->value != prVar17->value) || (NAN(prVar9->value) || NAN(prVar17->value))) {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar9,prVar17,plVar2);
              prVar9 = prVar17;
            }
            lVar11 = lVar11 + -0x20;
          } while (lVar11 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar9,prVar1,plVar2);
        }
        iVar5 = *(int *)(*(long *)(this + 0x70) + lVar7 * 0xc);
        iVar10 = *(int *)(*(long *)(this + 0x70) + 4 + lVar7 * 0xc);
        goto LAB_005ec01c;
      case 2:
        if (1 < (int)r_size) {
          prVar9 = *(rc_data **)(this + 0x60);
          lVar11 = (long)(int)r_size;
          plVar2 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar1 = prVar9 + lVar11;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar9,prVar1,(int)LZCOUNT(lVar11) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar9,prVar1);
          lVar11 = lVar11 * 0x20 + -0x20;
          prVar17 = prVar9;
          do {
            prVar17 = prVar17 + 1;
            if ((prVar9->value != prVar17->value) || (NAN(prVar9->value) || NAN(prVar17->value))) {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar9,prVar17,plVar2);
              prVar9 = prVar17;
            }
            lVar11 = lVar11 + -0x20;
          } while (lVar11 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar9,prVar1,plVar2);
        }
        iVar5 = *(int *)(*(long *)(this + 0x70) + lVar7 * 0xc);
        iVar10 = *(int *)(*(long *)(this + 0x70) + 4 + lVar7 * 0xc);
        if (-1 < (int)r_size) {
          selected = -2;
          lVar7 = -1;
          iVar14 = 0;
          do {
            iVar13 = (int)lVar7;
            if (iVar10 < iVar14) {
              iVar13 = selected;
            }
            if (iVar14 < iVar5) {
              iVar13 = selected;
            }
            selected = iVar13;
            if (selected == -2) {
              if (lVar7 + 1U == (ulong)r_size) break;
            }
            else if (((longdouble)0 <
                      *(longdouble *)
                       ((long)*(__uniq_ptr_data<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>,_true,_true>
                                *)reduced_cost + 0x20 + lVar7 * 0x20)) ||
                    (lVar7 + 1U == (ulong)r_size)) goto LAB_005ec024;
            lVar7 = lVar7 + 1;
            iVar14 = iVar14 + *(int *)((long)*(__uniq_ptr_data<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>,_true,_true>
                                               *)reduced_cost + 0x14 + lVar7 * 0x20);
          } while( true );
        }
LAB_005ec01c:
        selected = branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::
                   solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[]>>>
                             ((branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double> *)
                              (this + 0x80),
                              (unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                               *)reduced_cost,r_size,iVar5,iVar10);
        break;
      case 3:
        if (1 < (int)r_size) {
          prVar9 = *(rc_data **)(this + 0x60);
          lVar11 = (long)(int)r_size;
          plVar2 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar1 = prVar9 + lVar11;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar9,prVar1,(int)LZCOUNT(lVar11) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar9,prVar1);
          lVar11 = lVar11 * 0x20 + -0x20;
          prVar17 = prVar9;
          do {
            prVar17 = prVar17 + 1;
            if ((prVar9->value != prVar17->value) || (NAN(prVar9->value) || NAN(prVar17->value))) {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar9,prVar17,plVar2);
              prVar9 = prVar17;
            }
            lVar11 = lVar11 + -0x20;
          } while (lVar11 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar9,prVar1,plVar2);
        }
        if (-1 < (int)r_size) {
          lVar11 = -1;
          iVar10 = 0;
          iVar5 = -2;
          do {
            selected = (int)lVar11;
            if (*(int *)(*(long *)(this + 0x70) + 4 + lVar7 * 0xc) < iVar10) {
              selected = iVar5;
            }
            if (iVar10 < *(int *)(*(long *)(this + 0x70) + lVar7 * 0xc)) {
              selected = iVar5;
            }
            if (selected == -2) {
              if (lVar11 + 1U == (ulong)r_size) break;
            }
            else if (((longdouble)0 <
                      *(longdouble *)
                       ((long)*(__uniq_ptr_data<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>,_true,_true>
                                *)reduced_cost + 0x20 + lVar11 * 0x20)) ||
                    (lVar11 + 1U == (ulong)r_size)) goto LAB_005ec024;
            lVar11 = lVar11 + 1;
            iVar10 = iVar10 + *(int *)((long)*(__uniq_ptr_data<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>,_true,_true>
                                               *)reduced_cost + 0x14 + lVar11 * 0x20);
            iVar5 = selected;
          } while( true );
        }
      case 1:
        selected = exhaustive_solver<baryonyx::itm::minimize_tag,long_double>::
                   solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[]>>>
                             ((exhaustive_solver<baryonyx::itm::minimize_tag,long_double> *)
                              (this + 0x100),k,
                              (unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                               *)reduced_cost,r_size);
        break;
      default:
        if (1 < (int)r_size) {
          prVar9 = *(rc_data **)(this + 0x60);
          lVar11 = (long)(int)r_size;
          plVar2 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar1 = prVar9 + lVar11;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar9,prVar1,(int)LZCOUNT(lVar11) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar9,prVar1);
          lVar11 = lVar11 * 0x20 + -0x20;
          prVar17 = prVar9;
          do {
            prVar17 = prVar17 + 1;
            if ((prVar9->value != prVar17->value) || (NAN(prVar9->value) || NAN(prVar17->value))) {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar9,prVar17,plVar2);
              prVar9 = prVar17;
            }
            lVar11 = lVar11 + -0x20;
          } while (lVar11 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar9,prVar1,plVar2);
        }
        if ((int)r_size < 0) {
          selected = -2;
        }
        else {
          uVar15 = 0xffffffffffffffff;
          iVar10 = 0;
          _Var8._M_t.
          super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
          .
          super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_false>
          ._M_head_impl =
               *(tuple<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                 *)reduced_cost;
          iVar5 = -2;
          do {
            selected = (int)uVar15;
            if (*(int *)(*(long *)(this + 0x70) + 4 + lVar7 * 0xc) < iVar10) {
              selected = iVar5;
            }
            if (iVar10 < *(int *)(*(long *)(this + 0x70) + lVar7 * 0xc)) {
              selected = iVar5;
            }
            if ((selected != -2) &&
               ((longdouble)0 <
                *(longdouble *)
                 _Var8._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_false>
                 ._M_head_impl)) break;
            iVar10 = iVar10 + *(int *)((long)_Var8._M_t.
                                             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                                             .
                                             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_false>
                                             ._M_head_impl + 0x14);
            uVar15 = uVar15 + 1;
            _Var8._M_t.
            super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
            .
            super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_false>
            ._M_head_impl =
                 (tuple<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                  )((long)_Var8._M_t.
                          super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                          .
                          super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_false>
                          ._M_head_impl + 0x20);
            iVar5 = selected;
          } while (r_size != uVar15);
        }
      }
LAB_005ec024:
      bVar3 = local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>
                        (this,x,(row_value *)local_90._8_8_,k,selected,r_size,local_48,local_58);
      bVar16 = (bool)(bVar16 | bVar3);
      piVar4 = (first->current)._M_current + -1;
      (first->current)._M_current = piVar4;
    } while (piVar4 != (last->current)._M_current);
  }
  return bVar16;
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float obj_amp)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != r_size; ++i)
                R[i].value +=
                  obj_amp * c((std::get<0>(it) + R[i].id)->column, x);

            Float pi_change;
            int selected;

            switch (Z[k]) {
            case subsolver_type::branch_and_bound:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = bb.solve(R, r_size, b[k].min, b[k].max);
                break;
            case subsolver_type::exhaustive:
                selected = ex.solve(k, R, r_size);
                break;
            case subsolver_type::unconstrained_branch_and_bound:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables(r_size, b[k].min, b[k].max);
                if (selected == -2)
                    selected = bb.solve(R, r_size, b[k].min, b[k].max);
                break;
            case subsolver_type::unconstrained_exhaustive:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables(r_size, b[k].min, b[k].max);
                if (selected == -2)
                    selected = ex.solve(k, R, r_size);
                break;
            case subsolver_type::linear:
            default:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables_101(r_size, b[k].min, b[k].max);
                break;
            }

            pi_change = local_affect(
              x, std::get<0>(it), k, selected, r_size, kappa, delta);
            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }